

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::Storage::Storage(Storage *this,LogBuilderPtr *defaultLogBuilder)

{
  undefined *puVar1;
  RegisteredHitCounters *this_00;
  RegisteredLoggers *pRVar2;
  VRegistry *this_01;
  Logger *this_02;
  Configurations *this_03;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  Logger *local_58;
  Logger *performanceLogger;
  string local_48;
  LogBuilderPtr *local_18;
  LogBuilderPtr *defaultLogBuilder_local;
  Storage *this_local;
  
  local_18 = defaultLogBuilder;
  defaultLogBuilder_local = (LogBuilderPtr *)this;
  NoCopy::NoCopy((NoCopy *)this);
  threading::ThreadSafe::ThreadSafe(&this->super_ThreadSafe);
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00187b18;
  this_00 = (RegisteredHitCounters *)operator_new(0x28);
  (this_00->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe.field_0x8 = 0;
  (this_00->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RegisteredHitCounters::RegisteredHitCounters(this_00);
  this->m_registeredHitCounters = this_00;
  pRVar2 = (RegisteredLoggers *)operator_new(0xd0);
  RegisteredLoggers::RegisteredLoggers(pRVar2,local_18);
  this->m_registeredLoggers = pRVar2;
  this->m_flags = 0;
  this_01 = (VRegistry *)operator_new(0x48);
  VRegistry::VRegistry(this_01,0,&this->m_flags);
  this->m_vRegistry = this_01;
  utils::CommandLineArgs::CommandLineArgs(&this->m_commandLineArgs);
  std::function<void(char_const*,unsigned_long)>::function<void(&)(char_const*,unsigned_long),void>
            ((function<void(char_const*,unsigned_long)> *)&this->m_preRollOutCallback,
             defaultPreRollOutCallback);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  ::map(&this->m_logDispatchCallbacks);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::PerformanceTrackingCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::PerformanceTrackingCallback>_>_>_>
  ::map(&this->m_performanceTrackingCallbacks);
  std::vector<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>::vector
            (&this->m_customFormatSpecifiers);
  puVar1 = consts::kDefaultLoggerId;
  pRVar2 = this->m_registeredLoggers;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,puVar1,(allocator *)((long)&performanceLogger + 7));
  RegisteredLoggers::get(pRVar2,&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)((long)&performanceLogger + 7));
  puVar1 = consts::kPerformanceLoggerId;
  pRVar2 = this->m_registeredLoggers;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,puVar1,&local_79);
  this_02 = RegisteredLoggers::get(pRVar2,&local_78,true);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_58 = this_02;
  this_03 = Logger::configurations(this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"%datetime %level %msg",&local_a1);
  Configurations::setGlobally(this_03,Format,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  Logger::reconfigure(local_58);
  addFlag(this,AllowVerboseIfModuleNotSpecified);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"DefaultLogDispatchCallback",&local_c9);
  installLogDispatchCallback<el::base::DefaultLogDispatchCallback>(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"DefaultPerformanceTrackingCallback",&local_f1);
  installPerformanceTrackingCallback<el::base::DefaultPerformanceTrackingCallback>(this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

explicit Storage(const LogBuilderPtr& defaultLogBuilder) :
#endif  // ELPP_ASYNC_LOGGING
        m_registeredHitCounters(new base::RegisteredHitCounters()),
        m_registeredLoggers(new base::RegisteredLoggers(defaultLogBuilder)),
        m_flags(0x0),
        m_vRegistry(new base::VRegistry(0, &m_flags)),
#if ELPP_ASYNC_LOGGING
        m_asyncLogQueue(new base::AsyncLogQueue()),
        m_asyncDispatchWorker(asyncDispatchWorker),
#endif  // ELPP_ASYNC_LOGGING
        m_preRollOutCallback(base::defaultPreRollOutCallback) {
        // Register default logger
        m_registeredLoggers->get(std::string(base::consts::kDefaultLoggerId));
        // Register performance logger and reconfigure format
        Logger* performanceLogger = m_registeredLoggers->get(std::string(base::consts::kPerformanceLoggerId));
        performanceLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%datetime %level %msg"));
        performanceLogger->reconfigure();
#if defined(ELPP_SYSLOG)
        // Register syslog logger and reconfigure format
        Logger* sysLogLogger = m_registeredLoggers->get(std::string(base::consts::kSysLogLoggerId));
        sysLogLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%level: %msg"));
        sysLogLogger->reconfigure();
#else
        ELPP_UNUSED(base::consts::kSysLogLoggerId);
#endif //  defined(ELPP_SYSLOG)
        addFlag(LoggingFlag::AllowVerboseIfModuleNotSpecified);
#if ELPP_ASYNC_LOGGING
        installLogDispatchCallback<base::AsyncLogDispatchCallback>(std::string("AsyncLogDispatchCallback"));
#else
        installLogDispatchCallback<base::DefaultLogDispatchCallback>(std::string("DefaultLogDispatchCallback"));
#endif  // ELPP_ASYNC_LOGGING
            installPerformanceTrackingCallback<base::DefaultPerformanceTrackingCallback>(std::string("DefaultPerformanceTrackingCallback"));
            ELPP_INTERNAL_INFO(1, "Easylogging++ has been initialized");
#if ELPP_ASYNC_LOGGING
        m_asyncDispatchWorker->start();
#endif  // ELPP_ASYNC_LOGGING
    }